

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O1

void __thiscall CBlockPolicyEstimator::FlushUnconfirmed(CBlockPolicyEstimator *this)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  Logger *this_00;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  double local_38;
  size_t num_entries;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = std::chrono::_V2::steady_clock::now();
  criticalblock8.super_unique_lock._M_device = &(this->m_cs_fee_estimator).super_mutex;
  criticalblock8.super_unique_lock._M_owns = false;
  std::unique_lock<std::mutex>::lock(&criticalblock8.super_unique_lock);
  num_entries = (this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  while ((this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    _removeTx(this,(uint256 *)
                   ((this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1),
              false);
  }
  lVar4 = std::chrono::_V2::steady_clock::now();
  this_00 = LogInstance();
  bVar2 = BCLog::Logger::WillLogCategoryLevel(this_00,ESTIMATEFEE,Debug);
  if (bVar2) {
    local_38 = (double)(lVar4 - lVar3) / 1000000000.0;
    logging_function._M_str = "FlushUnconfirmed";
    logging_function._M_len = 0x10;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
    ;
    source_file._M_len = 0x5f;
    LogPrintFormatInternal<unsigned_long,double>
              (logging_function,source_file,0x422,ESTIMATEFEE,Debug,
               (ConstevalFormatString<2U>)0x806dde,&num_entries,&local_38);
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock8.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CBlockPolicyEstimator::FlushUnconfirmed()
{
    const auto startclear{SteadyClock::now()};
    LOCK(m_cs_fee_estimator);
    size_t num_entries = mapMemPoolTxs.size();
    // Remove every entry in mapMemPoolTxs
    while (!mapMemPoolTxs.empty()) {
        auto mi = mapMemPoolTxs.begin();
        _removeTx(mi->first, false); // this calls erase() on mapMemPoolTxs
    }
    const auto endclear{SteadyClock::now()};
    LogDebug(BCLog::ESTIMATEFEE, "Recorded %u unconfirmed txs from mempool in %.3fs\n", num_entries, Ticks<SecondsDouble>(endclear - startclear));
}